

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8_x509.cc
# Opt level: O0

PKCS12 * d2i_PKCS12(PKCS12 **a,uchar **in,long len)

{
  ASN1_INTEGER *pAVar1;
  PKCS12 *p12;
  size_t ber_len_local;
  uint8_t **ber_bytes_local;
  PKCS12 **out_p12_local;
  
  out_p12_local = (PKCS12 **)OPENSSL_malloc(0x10);
  if ((PKCS12 *)out_p12_local == (PKCS12 *)0x0) {
    out_p12_local = (PKCS12 **)0x0;
  }
  else {
    pAVar1 = (ASN1_INTEGER *)OPENSSL_memdup(*in,len);
    ((PKCS12 *)out_p12_local)->version = pAVar1;
    if (((PKCS12 *)out_p12_local)->version == (ASN1_INTEGER *)0x0) {
      OPENSSL_free(out_p12_local);
      out_p12_local = (PKCS12 **)0x0;
    }
    else {
      ((PKCS12 *)out_p12_local)->mac = (PKCS12_MAC_DATA *)len;
      *in = *in + len;
      if (a != (PKCS12 **)0x0) {
        PKCS12_free(*a);
        *a = (PKCS12 *)out_p12_local;
      }
    }
  }
  return (PKCS12 *)out_p12_local;
}

Assistant:

PKCS12 *d2i_PKCS12(PKCS12 **out_p12, const uint8_t **ber_bytes,
                   size_t ber_len) {
  PKCS12 *p12 = reinterpret_cast<PKCS12 *>(OPENSSL_malloc(sizeof(PKCS12)));
  if (!p12) {
    return NULL;
  }

  p12->ber_bytes =
      reinterpret_cast<uint8_t *>(OPENSSL_memdup(*ber_bytes, ber_len));
  if (!p12->ber_bytes) {
    OPENSSL_free(p12);
    return NULL;
  }

  p12->ber_len = ber_len;
  *ber_bytes += ber_len;

  if (out_p12) {
    PKCS12_free(*out_p12);
    *out_p12 = p12;
  }

  return p12;
}